

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_mat44_to_orientation(mat44 R,int *icod,int *jcod,int *kcod)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  mat33 R_00;
  mat33 R_01;
  undefined1 auVar6 [16];
  float (*pafVar7) [3];
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  float fVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [12];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  mat33 P;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  float local_120;
  mat33 Q;
  float afStack_ec [11];
  int *local_c0;
  int *local_b8;
  int *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  float local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  mat33 C;
  
  if (kcod != (int *)0x0 && (jcod != (int *)0x0 && icod != (int *)0x0)) {
    *kcod = 0;
    *jcod = 0;
    *icod = 0;
    fVar26 = SQRT(R.m[2][0] * R.m[2][0] + R.m[0][0] * R.m[0][0] + R.m[1][0] * R.m[1][0]);
    if ((fVar26 != 0.0) || (NAN(fVar26))) {
      fVar34 = SQRT(R.m[2][1] * R.m[2][1] + R.m[0][1] * R.m[0][1] + R.m[1][1] * R.m[1][1]);
      if ((fVar34 != 0.0) || (NAN(fVar34))) {
        auVar29._4_4_ = R.m[1][0];
        auVar29._0_4_ = R.m[0][0];
        auVar29._8_8_ = 0;
        auVar17._4_4_ = fVar26;
        auVar17._0_4_ = fVar26;
        auVar17._8_4_ = fVar26;
        auVar17._12_4_ = fVar26;
        auVar17 = divps(auVar29,auVar17);
        auVar28._4_4_ = R.m[2][0];
        auVar28._0_4_ = R.m[1][0];
        auVar28._8_8_ = 0;
        auVar19._4_4_ = fVar26;
        auVar19._0_4_ = fVar26;
        auVar19._8_4_ = fVar26;
        auVar19._12_4_ = fVar26;
        auVar29 = divps(auVar28,auVar19);
        fVar22 = R.m[0][1] / fVar34;
        auVar18._4_4_ = R.m[2][1];
        auVar18._0_4_ = R.m[1][1];
        auVar18._8_8_ = 0;
        auVar4._4_4_ = fVar34;
        auVar4._0_4_ = fVar34;
        auVar4._8_4_ = fVar34;
        auVar4._12_4_ = fVar34;
        auVar19 = divps(auVar18,auVar4);
        fVar26 = auVar17._0_4_;
        fVar34 = auVar17._4_4_;
        fVar30 = auVar29._4_4_;
        fVar27 = auVar19._4_4_ * fVar30 + fVar26 * fVar22 + fVar34 * auVar19._0_4_;
        if (0.0001 < ABS(fVar27)) {
          fVar22 = fVar22 - fVar27 * fVar26;
          auVar20._0_4_ = auVar19._0_4_ - fVar27 * auVar29._0_4_;
          auVar20._4_4_ = auVar19._4_4_ - fVar27 * fVar30;
          auVar20._8_4_ = auVar19._8_4_ - fVar27 * auVar29._8_4_;
          auVar20._12_4_ = auVar19._12_4_ - fVar27 * auVar29._12_4_;
          fVar27 = SQRT(auVar20._4_4_ * auVar20._4_4_ +
                        fVar22 * fVar22 + auVar20._0_4_ * auVar20._0_4_);
          if ((fVar27 == 0.0) && (!NAN(fVar27))) {
            return;
          }
          fVar22 = fVar22 / fVar27;
          auVar3._4_4_ = fVar27;
          auVar3._0_4_ = fVar27;
          auVar3._8_4_ = fVar27;
          auVar3._12_4_ = fVar27;
          auVar19 = divps(auVar20,auVar3);
        }
        fVar35 = SQRT(R.m[2][2] * R.m[2][2] + R.m[0][2] * R.m[0][2] + R.m[1][2] * R.m[1][2]);
        fVar27 = auVar19._0_4_;
        fVar21 = auVar19._4_4_;
        if ((fVar35 != 0.0) || (NAN(fVar35))) {
          fVar23 = R.m[1][2] / fVar35;
          auVar24._4_4_ = R.m[0][2];
          auVar24._0_4_ = R.m[2][2];
          auVar24._8_8_ = 0;
          auVar5._4_4_ = fVar35;
          auVar5._0_4_ = fVar35;
          auVar5._8_4_ = fVar35;
          auVar5._12_4_ = fVar35;
          auVar25 = divps(auVar24,auVar5);
        }
        else {
          fVar23 = fVar30 * fVar22 - fVar26 * fVar21;
          auVar25._0_4_ = fVar26 * fVar27 - fVar22 * auVar29._0_4_;
          auVar25._4_4_ = fVar34 * fVar21 - fVar27 * fVar30;
          auVar25._8_4_ = auVar17._8_4_ * auVar19._8_4_ - fVar27 * auVar29._8_4_;
          auVar25._12_4_ = auVar17._12_4_ * auVar19._12_4_ - fVar27 * auVar29._12_4_;
        }
        fVar35 = auVar25._4_4_;
        auVar31 = auVar25._4_12_;
        fVar32 = auVar25._0_4_ * fVar30 + fVar35 * fVar26 + fVar34 * fVar23;
        if (0.0001 < ABS(fVar32)) {
          fVar35 = fVar35 - fVar32 * fVar26;
          fVar23 = fVar23 - fVar32 * fVar34;
          fVar32 = auVar25._0_4_ - fVar32 * fVar30;
          fVar33 = SQRT(fVar32 * fVar32 + fVar35 * fVar35 + fVar23 * fVar23);
          if ((fVar33 == 0.0) && (!NAN(fVar33))) {
            return;
          }
          fVar35 = fVar35 / fVar33;
          fVar23 = fVar23 / fVar33;
          auVar25._0_4_ = fVar32 / fVar33;
          auVar25._4_12_ = auVar31;
        }
        fVar32 = fVar21 * auVar25._0_4_ + fVar22 * fVar35 + fVar27 * fVar23;
        if (0.0001 < ABS(fVar32)) {
          fVar35 = fVar35 - fVar32 * fVar22;
          fVar23 = fVar23 - fVar32 * fVar27;
          fVar32 = auVar25._0_4_ - fVar32 * fVar21;
          fVar33 = SQRT(fVar32 * fVar32 + fVar35 * fVar35 + fVar23 * fVar23);
          if ((fVar33 == 0.0) && (!NAN(fVar33))) {
            return;
          }
          fVar35 = fVar35 / fVar33;
          fVar23 = fVar23 / fVar33;
          auVar25._0_4_ = fVar32 / fVar33;
        }
        R_00.m[0][1] = fVar22;
        R_00.m[0][0] = fVar26;
        R_00.m[1][0] = fVar34;
        R_00.m[0][2] = fVar35;
        auVar6._8_4_ = fVar30;
        auVar6._0_8_ = CONCAT44(fVar23,fVar27);
        auVar6._12_4_ = fVar21;
        R_00.m[1][1] = fVar27;
        R_00.m[1][2] = fVar23;
        R_00.m[2][0] = (float)(int)auVar6._8_8_;
        R_00.m[2][1] = (float)(int)((ulong)auVar6._8_8_ >> 0x20);
        R_00.m[2][2] = auVar25._0_4_;
        fVar32 = nifti_mat33_determ(R_00);
        if ((fVar32 != 0.0) || (NAN(fVar32))) {
          local_120 = -666.0;
          local_124 = 3;
          local_12c = 2;
          iVar10 = 0;
          local_138 = 1;
          local_134 = local_138;
          local_130 = local_138;
          local_128 = local_138;
          local_c0 = icod;
          local_b8 = jcod;
          local_b0 = kcod;
          for (lVar13 = 1; lVar13 != 4; lVar13 = lVar13 + 1) {
            for (lVar14 = 1; lVar14 != 4; lVar14 = lVar14 + 1) {
              if (lVar13 != lVar14) {
                for (lVar16 = 1; lVar16 != 4; lVar16 = lVar16 + 1) {
                  if (lVar14 != lVar16 && lVar13 != lVar16) {
                    afStack_ec[5] = 0.0;
                    afStack_ec[6] = 0.0;
                    afStack_ec[7] = 0.0;
                    afStack_ec[8] = 0.0;
                    afStack_ec[1] = 0.0;
                    afStack_ec[2] = 0.0;
                    afStack_ec[3] = 0.0;
                    afStack_ec[4] = 0.0;
                    afStack_ec[9] = 0.0;
                    for (iVar10 = -1; iVar10 < 2; iVar10 = iVar10 + 2) {
                      for (iVar15 = -1; iVar15 < 2; iVar15 = iVar15 + 2) {
                        for (iVar11 = -1; iVar11 < 2; iVar11 = iVar11 + 2) {
                          afStack_ec[lVar13] = (float)iVar10;
                          afStack_ec[lVar14 + 3] = (float)iVar15;
                          afStack_ec[lVar16 + 6] = (float)iVar11;
                          R_01.m[0][1] = afStack_ec[2];
                          R_01.m[0][0] = afStack_ec[1];
                          R_01.m[1][0] = afStack_ec[4];
                          R_01.m[0][2] = afStack_ec[3];
                          R_01.m[1][2] = afStack_ec[6];
                          R_01.m[1][1] = afStack_ec[5];
                          R_01.m[2][1] = afStack_ec[8];
                          R_01.m[2][0] = afStack_ec[7];
                          R_01.m[2][2] = afStack_ec[9];
                          fVar33 = nifti_mat33_determ(R_01);
                          if (0.0 < fVar33 * fVar32) {
                            local_58 = auVar25._0_4_;
                            local_68 = CONCAT44(fVar23,fVar27);
                            uStack_60 = CONCAT44(fVar21,fVar30);
                            local_78 = CONCAT44(fVar22,fVar26);
                            uStack_70 = CONCAT44(fVar34,fVar35);
                            local_98._4_4_ = afStack_ec[6];
                            local_98._0_4_ = afStack_ec[5];
                            local_98._8_4_ = afStack_ec[7];
                            local_98._12_4_ = afStack_ec[8];
                            local_a8 = CONCAT44(afStack_ec[2],afStack_ec[1]);
                            uStack_a0 = CONCAT44(afStack_ec[4],afStack_ec[3]);
                            local_88 = afStack_ec[9];
                            pafVar7 = (float (*) [3])&C;
                            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                              lVar9 = lVar8 * 0xc;
                              fVar33 = *(float *)((long)&local_a8 + lVar9);
                              fVar1 = *(float *)((long)&local_a8 + lVar9 + 4);
                              fVar2 = *(float *)(local_98 + lVar9 + -8);
                              for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                                (*(float (*) [3])*pafVar7)[lVar9] =
                                     *(float *)((long)&uStack_60 + lVar9 * 4) * fVar2 +
                                     *(float *)((long)&local_78 + lVar9 * 4) * fVar33 +
                                     *(float *)((long)&uStack_70 + lVar9 * 4 + 4) * fVar1;
                              }
                              pafVar7 = pafVar7 + 1;
                            }
                            fVar33 = C.m[0][0] + C.m[1][1] + C.m[2][2];
                            if (local_120 < fVar33) {
                              local_134 = (int)lVar13;
                              local_12c = (int)lVar14;
                              local_124 = (int)lVar16;
                              local_138 = iVar10;
                              local_130 = iVar15;
                              local_128 = iVar11;
                              local_120 = fVar33;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                iVar10 = 4;
              }
            }
          }
          uVar12 = local_138 * local_134 + 3;
          iVar11 = 4;
          iVar15 = iVar11;
          if (uVar12 < 7) {
            iVar15 = *(int *)(&DAT_0011625c + (ulong)uVar12 * 4);
          }
          uVar12 = local_130 * local_12c + 3;
          if (uVar12 < 7) {
            iVar11 = *(int *)(&DAT_0011625c + (ulong)uVar12 * 4);
          }
          uVar12 = local_128 * local_124 + 3;
          if ((uVar12 < 7) && ((0x77U >> (uVar12 & 0x1f) & 1) != 0)) {
            iVar10 = *(int *)(&DAT_00116278 + (ulong)uVar12 * 4);
          }
          *local_c0 = iVar15;
          *local_b8 = iVar11;
          *local_b0 = iVar10;
        }
      }
    }
  }
  return;
}

Assistant:

void nifti_mat44_to_orientation( mat44 R , int *icod, int *jcod, int *kcod )
{
   float xi,xj,xk , yi,yj,yk , zi,zj,zk , val,detQ,detP ;
   mat33 P , Q , M ;
   int i,j,k=0,p,q,r , ibest,jbest,kbest,pbest,qbest,rbest ;
   float vbest ;

   if( icod == NULL || jcod == NULL || kcod == NULL ) return ; /* bad */

   *icod = *jcod = *kcod = 0 ; /* error returns, if sh*t happens */

   /* load column vectors for each (i,j,k) direction from matrix */

   /*-- i axis --*/ /*-- j axis --*/ /*-- k axis --*/

   xi = R.m[0][0] ; xj = R.m[0][1] ; xk = R.m[0][2] ;
   yi = R.m[1][0] ; yj = R.m[1][1] ; yk = R.m[1][2] ;
   zi = R.m[2][0] ; zj = R.m[2][1] ; zk = R.m[2][2] ;

   /* normalize column vectors to get unit vectors along each ijk-axis */

   /* normalize i axis */

   val = (float)sqrt( xi*xi + yi*yi + zi*zi ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xi /= val ; yi /= val ; zi /= val ;

   /* normalize j axis */

   val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xj /= val ; yj /= val ; zj /= val ;

   /* orthogonalize j axis to i axis, if needed */

   val = xi*xj + yi*yj + zi*zj ;    /* dot product between i and j */
   if( fabs(val) > 1.e-4 ){
     xj -= val*xi ; yj -= val*yi ; zj -= val*zi ;
     val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;  /* must renormalize */
     if( val == 0.0 ) return ;              /* j was parallel to i? */
     xj /= val ; yj /= val ; zj /= val ;
   }

   /* normalize k axis; if it is zero, make it the cross product i x j */

   val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
   if( val == 0.0 ){ xk = yi*zj-zi*yj; yk = zi*xj-zj*xi ; zk=xi*yj-yi*xj ; }
   else            { xk /= val ; yk /= val ; zk /= val ; }

   /* orthogonalize k to i */

   val = xi*xk + yi*yk + zi*zk ;    /* dot product between i and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xi ; yk -= val*yi ; zk -= val*zi ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   /* orthogonalize k to j */

   val = xj*xk + yj*yk + zj*zk ;    /* dot product between j and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xj ; yk -= val*yj ; zk -= val*zj ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   Q.m[0][0] = xi ; Q.m[0][1] = xj ; Q.m[0][2] = xk ;
   Q.m[1][0] = yi ; Q.m[1][1] = yj ; Q.m[1][2] = yk ;
   Q.m[2][0] = zi ; Q.m[2][1] = zj ; Q.m[2][2] = zk ;

   /* at this point, Q is the rotation matrix from the (i,j,k) to (x,y,z) axes */

   detQ = nifti_mat33_determ( Q ) ;
   if( detQ == 0.0 ) return ; /* shouldn't happen unless user is a DUFIS */

   /* Build and test all possible +1/-1 coordinate permutation matrices P;
      then find the P such that the rotation matrix M=PQ is closest to the
      identity, in the sense of M having the smallest total rotation angle. */

   /* Despite the formidable looking 6 nested loops, there are
      only 3*3*3*2*2*2 = 216 passes, which will run very quickly. */

   vbest = -666.0f ; ibest=pbest=qbest=rbest=1 ; jbest=2 ; kbest=3 ;
   for( i=1 ; i <= 3 ; i++ ){     /* i = column number to use for row #1 */
    for( j=1 ; j <= 3 ; j++ ){    /* j = column number to use for row #2 */
     if( i == j ) continue ;
      for( k=1 ; k <= 3 ; k++ ){  /* k = column number to use for row #3 */
       if( i == k || j == k ) continue ;
       P.m[0][0] = P.m[0][1] = P.m[0][2] =
        P.m[1][0] = P.m[1][1] = P.m[1][2] =
         P.m[2][0] = P.m[2][1] = P.m[2][2] = 0.0f ;
       for( p=-1 ; p <= 1 ; p+=2 ){    /* p,q,r are -1 or +1      */
        for( q=-1 ; q <= 1 ; q+=2 ){   /* and go into rows #1,2,3 */
         for( r=-1 ; r <= 1 ; r+=2 ){
           P.m[0][i-1] = p ; P.m[1][j-1] = q ; P.m[2][k-1] = r ;
           detP = nifti_mat33_determ(P) ;           /* sign of permutation */
           if( detP * detQ <= 0.0 ) continue ;  /* doesn't match sign of Q */
           M = nifti_mat33_mul(P,Q) ;

           /* angle of M rotation = 2.0*acos(0.5*sqrt(1.0+trace(M)))       */
           /* we want largest trace(M) == smallest angle == M nearest to I */

           val = M.m[0][0] + M.m[1][1] + M.m[2][2] ; /* trace */
           if( val > vbest ){
             vbest = val ;
             ibest = i ; jbest = j ; kbest = k ;
             pbest = p ; qbest = q ; rbest = r ;
           }
   }}}}}}

   /* At this point ibest is 1 or 2 or 3; pbest is -1 or +1; etc.

      The matrix P that corresponds is the best permutation approximation
      to Q-inverse; that is, P (approximately) takes (x,y,z) coordinates
      to the (i,j,k) axes.

      For example, the first row of P (which contains pbest in column ibest)
      determines the way the i axis points relative to the anatomical
      (x,y,z) axes.  If ibest is 2, then the i axis is along the y axis,
      which is direction P2A (if pbest > 0) or A2P (if pbest < 0).

      So, using ibest and pbest, we can assign the output code for
      the i axis.  Mutatis mutandis for the j and k axes, of course. */

   switch( ibest*pbest ){
     case  1: i = NIFTI_L2R ; break ;
     case -1: i = NIFTI_R2L ; break ;
     case  2: i = NIFTI_P2A ; break ;
     case -2: i = NIFTI_A2P ; break ;
     case  3: i = NIFTI_I2S ; break ;
     case -3: i = NIFTI_S2I ; break ;
   }

   switch( jbest*qbest ){
     case  1: j = NIFTI_L2R ; break ;
     case -1: j = NIFTI_R2L ; break ;
     case  2: j = NIFTI_P2A ; break ;
     case -2: j = NIFTI_A2P ; break ;
     case  3: j = NIFTI_I2S ; break ;
     case -3: j = NIFTI_S2I ; break ;
   }

   switch( kbest*rbest ){
     case  1: k = NIFTI_L2R ; break ;
     case -1: k = NIFTI_R2L ; break ;
     case  2: k = NIFTI_P2A ; break ;
     case -2: k = NIFTI_A2P ; break ;
     case  3: k = NIFTI_I2S ; break ;
     case -3: k = NIFTI_S2I ; break ;
   }

   *icod = i ; *jcod = j ; *kcod = k ; return ;
}